

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator fmt::v6::
         vformat_to<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>>,wchar_t,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>>,wchar_t>>
                   (range out,basic_string_view<wchar_t> format_str,
                   basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
                   args,locale_ref loc)

{
  basic_string_view<wchar_t> format_str_00;
  basic_string_view<wchar_t> str;
  format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
  *in_RDX;
  locale_ref in_RSI;
  wchar_t *in_RDI;
  format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
  *in_R8;
  size_t in_R9;
  format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
  h;
  wchar_t *in_stack_ffffffffffffff18;
  size_t in_stack_ffffffffffffff58;
  range in_stack_ffffffffffffff60;
  basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>
  local_88 [2];
  format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
  *pfStack_18;
  buffer<wchar_t> *local_8;
  
  str.size_ = in_stack_ffffffffffffff58;
  str.data_ = in_RDI;
  pfStack_18 = in_RDX;
  format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
  ::format_handler(in_R8,in_stack_ffffffffffffff60,str,SUB81(in_RDX,0),in_RSI);
  format_str_00.size_ = in_R9;
  format_str_00.data_ = in_stack_ffffffffffffff18;
  internal::
  parse_format_string<false,wchar_t,fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>>,wchar_t,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>>,wchar_t>>&>
            (format_str_00,pfStack_18);
  local_8 = (buffer<wchar_t> *)
            basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>
            ::out(local_88);
  format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
  ::~format_handler((format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
                     *)0x2643d2);
  return (iterator)local_8;
}

Assistant:

typename Context::iterator vformat_to(
    typename ArgFormatter::range out, basic_string_view<Char> format_str,
    basic_format_args<Context> args,
    internal::locale_ref loc = internal::locale_ref()) {
  format_handler<ArgFormatter, Char, Context> h(out, format_str, args, loc);
  internal::parse_format_string<false>(format_str, h);
  return h.context.out();
}